

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fComputeShaderBuiltinVarTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::ComputeBuiltinVarCase::~ComputeBuiltinVarCase(ComputeBuiltinVarCase *this)

{
  code *pcVar1;
  ComputeBuiltinVarCase *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

ComputeBuiltinVarCase::~ComputeBuiltinVarCase (void)
{
	ComputeBuiltinVarCase::deinit();
}